

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error externalEntityInitProcessor3(XML_Parser parser,char *start,char *end,char **endPtr)

{
  int iVar1;
  XML_Error XVar2;
  XML_Error result;
  int tok;
  char *next;
  char **endPtr_local;
  char *end_local;
  char *start_local;
  XML_Parser parser_local;
  
  next = (char *)endPtr;
  endPtr_local = (char **)end;
  end_local = start;
  start_local = (char *)parser;
  iVar1 = (**(code **)(*(long *)((long)parser + 0x118) + 8))
                    (*(long *)((long)parser + 0x118),start,end,&result);
  if (iVar1 == -2) {
    if (next == (char *)0x0) {
      *(char **)(start_local + 0x218) = end_local;
      parser_local._4_4_ = XML_ERROR_PARTIAL_CHAR;
    }
    else {
      *(char **)next = end_local;
      parser_local._4_4_ = XML_ERROR_NONE;
    }
  }
  else if (iVar1 == -1) {
    if (next == (char *)0x0) {
      *(char **)(start_local + 0x218) = end_local;
      parser_local._4_4_ = XML_ERROR_UNCLOSED_TOKEN;
    }
    else {
      *(char **)next = end_local;
      parser_local._4_4_ = XML_ERROR_NONE;
    }
  }
  else {
    if (iVar1 == 0xc) {
      XVar2 = processXmlDecl(start_local,1,end_local,_result);
      if (XVar2 != XML_ERROR_NONE) {
        return XVar2;
      }
      end_local = _result;
    }
    *(code **)(start_local + 0x208) = externalEntityContentProcessor;
    start_local[0x23c] = '\x01';
    start_local[0x23d] = '\0';
    start_local[0x23e] = '\0';
    start_local[0x23f] = '\0';
    parser_local._4_4_ =
         doContent(start_local,1,*(ENCODING **)(start_local + 0x118),end_local,(char *)endPtr_local,
                   (char **)next);
  }
  return parser_local._4_4_;
}

Assistant:

static
enum XML_Error externalEntityInitProcessor3(XML_Parser parser,
                                            const char *start,
                                            const char *end,
                                            const char **endPtr)
{
  const char *next;
  int tok = XmlContentTok(encoding, start, end, &next);
  switch (tok) {
  case XML_TOK_XML_DECL:
    {
      enum XML_Error result = processXmlDecl(parser, 1, start, next);
      if (result != XML_ERROR_NONE)
        return result;
      start = next;
    }
    break;
  case XML_TOK_PARTIAL:
    if (endPtr) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
    eventPtr = start;
    return XML_ERROR_UNCLOSED_TOKEN;
  case XML_TOK_PARTIAL_CHAR:
    if (endPtr) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
    eventPtr = start;
    return XML_ERROR_PARTIAL_CHAR;
  }
  processor = externalEntityContentProcessor;
  tagLevel = 1;
  return doContent(parser, 1, encoding, start, end, endPtr);
}